

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

void buffer_mmap(uint32_t id,uint32_t fd,uint64_t cpu_start,uint64_t len,uint64_t mmap_offset)

{
  mmt_fd_type mVar1;
  cpu_mapping *mapping;
  uint8_t *puVar2;
  
  mapping = (cpu_mapping *)calloc(0x100,1);
  mapping->fd = fd;
  mVar1 = demmt_get_fdtype(fd);
  mapping->fdtype = mVar1;
  mapping->mmap_offset = mmap_offset;
  puVar2 = (uint8_t *)calloc(len,1);
  mapping->data = puVar2;
  mapping->length = len;
  mapping->id = id;
  mapping->cpu_addr = cpu_start;
  set_cpu_mapping(id,mapping);
  return;
}

Assistant:

void buffer_mmap(uint32_t id, uint32_t fd, uint64_t cpu_start, uint64_t len, uint64_t mmap_offset)
{
	struct cpu_mapping *mapping = calloc(sizeof(struct cpu_mapping), 1);
	mapping->fd = fd;
	mapping->fdtype = demmt_get_fdtype(fd);
	mapping->mmap_offset = mmap_offset;
	mapping->data = calloc(len, 1);
	mapping->length = len;
	mapping->id = id;
	mapping->cpu_addr = cpu_start;

	set_cpu_mapping(id, mapping);
}